

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qoscbundle.cpp
# Opt level: O3

void __thiscall QOscBundle::QOscBundle(QOscBundle *this,QByteArray *data)

{
  int iVar1;
  uint uVar2;
  QDebug QVar3;
  undefined8 uVar4;
  int *piVar5;
  Data *pDVar6;
  bool bVar7;
  QDebug QVar8;
  bool bVar9;
  char cVar10;
  qsizetype qVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  undefined8 *puVar17;
  QOscBundle *pQVar18;
  uint uVar19;
  uint uVar20;
  long in_FS_OFFSET;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QOscBundle subBundle;
  undefined1 local_f8 [20];
  undefined4 uStack_e4;
  QOscBundle *pQStack_e0;
  Data *local_d8;
  QArrayDataPointer<QOscMessage> QStack_d0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  Latin1Content LStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  QByteArray local_98;
  QByteArray local_78;
  QDebug local_58;
  undefined8 uStack_50;
  Data *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_isValid = false;
  this->m_immediate = false;
  this->m_timeEpoch = 0;
  this->m_timePico = 0;
  (this->m_bundles).d.d = (Data *)0x0;
  (this->m_bundles).d.ptr = (QOscBundle *)0x0;
  (this->m_bundles).d.size = 0;
  (this->m_messages).d.d = (Data *)0x0;
  (this->m_messages).d.ptr = (QOscMessage *)0x0;
  (this->m_messages).d.size = 0;
  lcTuioBundle();
  if (((byte)lcTuioBundle::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_f8[0] = true;
    local_f8[1] = false;
    local_f8._2_2_ = 0;
    local_f8._4_4_ = 0;
    local_f8._8_4_ = 0;
    local_f8._12_4_ = 0;
    local_f8._16_4_ = 0;
    uStack_e4 = 0;
    pQStack_e0 = (QOscBundle *)lcTuioBundle::category.name;
    QMessageLogger::debug();
    QByteArray::toHex((char)&local_b8);
    puVar17 = (undefined8 *)CONCAT44(uStack_ac,uStack_b0);
    if (puVar17 == (undefined8 *)0x0) {
      puVar17 = &QByteArray::_empty;
    }
    QDebug::putByteArray((char *)&local_58,(ulong)puVar17,LStack_a8);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    piVar5 = (int *)CONCAT44(uStack_b4,local_b8);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_b4,local_b8),1,0x10);
      }
    }
    QDebug::~QDebug(&local_58);
  }
  local_58.stream = (Stream *)0x0;
  uStack_50._0_4_ = 0;
  uStack_50._4_4_ = 0;
  local_48 = (Data *)0x0;
  pcVar15 = (data->d).ptr;
  qVar11 = (data->d).size;
  local_f8._0_4_ = (undefined4)qVar11;
  local_f8._4_4_ = (undefined4)((ulong)qVar11 >> 0x20);
  local_f8._8_4_ = SUB84(pcVar15,0);
  local_f8._12_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
  qVar11 = QByteArrayView::indexOf((QByteArrayView *)local_f8,'\0',0);
  QVar3.stream = local_58.stream;
  if ((int)(uint)qVar11 < 0) {
    local_58.stream = (Stream *)0x0;
    uStack_50._0_4_ = 0;
    uStack_50._4_4_ = 0;
    local_48 = (Data *)0x0;
    if ((QOscBundle *)QVar3.stream != (QOscBundle *)0x0) {
      LOCK();
      *(int *)QVar3.stream = *(int *)QVar3.stream + -1;
      iVar1 = *(int *)QVar3.stream;
      UNLOCK();
joined_r0x00105ce3:
      if (iVar1 == 0) {
        QArrayData::deallocate((QArrayData *)QVar3.stream,1,0x10);
      }
    }
  }
  else {
    QByteArray::mid((longlong)local_f8,(longlong)data);
    QVar8.stream = local_58.stream;
    QVar3.stream = (Stream *)CONCAT44(local_f8._4_4_,local_f8._0_4_);
    uVar4._4_4_ = local_f8._12_4_;
    uVar4._0_4_ = local_f8._8_4_;
    local_f8._0_4_ = SUB84(local_58.stream,0);
    local_f8._4_4_ = (undefined4)((ulong)local_58.stream >> 0x20);
    pDVar6 = (Data *)CONCAT44(uStack_e4,local_f8._16_4_);
    local_f8._8_4_ = (undefined4)uStack_50;
    local_f8._12_4_ = SUB84(uStack_50,4);
    local_f8._16_4_ = SUB84(local_48,0);
    uStack_e4 = (undefined4)((ulong)local_48 >> 0x20);
    uStack_50 = uVar4;
    local_48 = pDVar6;
    if ((QOscBundle *)local_58.stream != (QOscBundle *)0x0) {
      LOCK();
      *(int *)local_58.stream = *(int *)local_58.stream + -1;
      UNLOCK();
      if (*(int *)local_58.stream == 0) {
        local_58.stream = QVar3.stream;
        QArrayData::deallocate((QArrayData *)QVar8.stream,1,0x10);
        QVar3.stream = local_58.stream;
      }
    }
    local_58.stream = QVar3.stream;
    local_f8[0] = true;
    local_f8[1] = false;
    local_f8._2_2_ = 0x11;
    local_f8._4_4_ = 0;
    pQVar18 = (QOscBundle *)&local_58;
    bVar9 = operator!=((QByteArray *)pQVar18,(char **)local_f8);
    if (!bVar9) {
      uVar20 = (uint)qVar11 & 0x7ffffffc;
      uVar13 = (ulong)uVar20;
      lVar12 = (data->d).size;
      if (((uint)(uVar13 + 4) <= (uint)lVar12) && (7 < (long)(lVar12 - (uVar13 + 4)))) {
        pcVar15 = (data->d).ptr;
        if (pcVar15 == (char *)0x0) {
          pcVar15 = (char *)&QByteArray::_empty;
        }
        uVar20 = uVar20 + 0xc;
        if (uVar20 < (uint)lVar12) {
          uVar14 = *(uint *)(pcVar15 + uVar13 + 4);
          uVar2 = *(uint *)(pcVar15 + uVar13 + 8);
          bVar9 = uVar2 == 0x1000000 && uVar14 == 0;
          uVar16 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                   uVar14 << 0x18;
          uVar14 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
          do {
            if ((long)(lVar12 - (ulong)uVar20) < 4) break;
            pcVar15 = (data->d).ptr;
            if (pcVar15 == (char *)0x0) {
              pcVar15 = (char *)&QByteArray::_empty;
            }
            uVar2 = *(uint *)(pcVar15 + uVar20);
            uVar19 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
            ;
            if ((long)(lVar12 - (ulong)(uVar20 + 4)) < (long)(ulong)uVar19) break;
            if (uVar2 == 0) {
              lcTuioBundle();
              if (((byte)lcTuioBundle::category.field_2.bools.enabledWarning._q_value._M_base._M_i &
                  1) != 0) {
                QOscBundle(pQVar18);
              }
              this->m_isValid = true;
              this->m_immediate = bVar9;
              this->m_timeEpoch = uVar16;
              this->m_timePico = uVar14;
              break;
            }
            local_78.d.size = -0x5555555555555556;
            local_78.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_78.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
            QByteArray::mid((longlong)&local_78,(longlong)data);
            local_98.d.size = -0x5555555555555556;
            local_98.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_98.d.ptr = (storage_type *)0xaaaaaaaaaaaaaaaa;
            QByteArray::QByteArray(&local_98,"#bundle",8);
            if (((QOscBundle *)local_78.d.size == (QOscBundle *)0x0) || (*local_78.d.ptr != '/')) {
              QVar21.m_data = local_78.d.ptr;
              QVar21.m_size = local_78.d.size;
              QVar22.m_data = local_98.d.ptr;
              QVar22.m_size = local_98.d.size;
              pQVar18 = (QOscBundle *)local_78.d.size;
              cVar10 = QtPrivate::startsWith(QVar21,QVar22);
              if (cVar10 == '\0') {
                lcTuioBundle();
                if (((byte)lcTuioBundle::category.field_2.bools.enabledWarning._q_value._M_base._M_i
                    & 1) != 0) {
                  QOscBundle(pQVar18);
                }
                goto LAB_00105d82;
              }
              QStack_d0.ptr = (QOscMessage *)0xaaaaaaaaaaaaaaaa;
              QStack_d0.size = -0x5555555555555556;
              local_d8 = (Data *)0xaaaaaaaaaaaaaaaa;
              QStack_d0.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_f8._16_4_ = 0xaaaaaaaa;
              uStack_e4 = 0xaaaaaaaa;
              pQStack_e0 = (QOscBundle *)0xaaaaaaaaaaaaaaaa;
              local_f8[0] = true;
              local_f8[1] = true;
              local_f8._2_2_ = 0xaaaa;
              local_f8._4_4_ = 0xaaaaaaaa;
              local_f8._8_4_ = 0xaaaaaaaa;
              local_f8._12_4_ = 0xaaaaaaaa;
              QOscBundle((QOscBundle *)local_f8,&local_78);
              if ((bool)local_f8[0] == true) {
                this->m_isValid = true;
                this->m_immediate = bVar9;
                this->m_timeEpoch = uVar16;
                this->m_timePico = uVar14;
                QtPrivate::QMovableArrayOps<QOscBundle>::emplace<QOscBundle_const&>
                          ((QMovableArrayOps<QOscBundle> *)&this->m_bundles,(this->m_bundles).d.size
                           ,(QOscBundle *)local_f8);
                QList<QOscBundle>::end(&this->m_bundles);
              }
              QArrayDataPointer<QOscMessage>::~QArrayDataPointer(&QStack_d0);
              pQVar18 = (QOscBundle *)(local_f8 + 0x10);
              QArrayDataPointer<QOscBundle>::~QArrayDataPointer
                        ((QArrayDataPointer<QOscBundle> *)pQVar18);
            }
            else {
              QStack_d0.ptr = (QOscMessage *)0xaaaaaaaaaaaaaaaa;
              local_d8 = (Data *)0xaaaaaaaaaaaaaaaa;
              QStack_d0.d = (Data *)0xaaaaaaaaaaaaaaaa;
              local_f8._16_4_ = 0xaaaaaaaa;
              uStack_e4 = 0xaaaaaaaa;
              pQStack_e0 = (QOscBundle *)0xaaaaaaaaaaaaaaaa;
              local_f8[0] = true;
              local_f8[1] = true;
              local_f8._2_2_ = 0xaaaa;
              local_f8._4_4_ = 0xaaaaaaaa;
              local_f8._8_4_ = 0xaaaaaaaa;
              local_f8._12_4_ = 0xaaaaaaaa;
              QOscMessage::QOscMessage((QOscMessage *)local_f8,&local_78);
              bVar7 = (bool)local_f8[0];
              if ((bool)local_f8[0] == true) {
                this->m_isValid = true;
                this->m_immediate = bVar9;
                this->m_timeEpoch = uVar16;
                this->m_timePico = uVar14;
                QtPrivate::QMovableArrayOps<QOscMessage>::emplace<QOscMessage_const&>
                          ((QMovableArrayOps<QOscMessage> *)&this->m_messages,
                           (this->m_messages).d.size,(QOscMessage *)local_f8);
                QList<QOscMessage>::end(&this->m_messages);
              }
              else {
                lcTuioBundle();
                if (((byte)lcTuioBundle::category.field_2.bools.enabledWarning._q_value._M_base._M_i
                    & 1) != 0) {
                  local_b8 = 2;
                  uStack_b4 = 0;
                  uStack_b0 = 0;
                  uStack_ac = 0;
                  LStack_a8 = ContainsBinary;
                  uStack_a4 = 0;
                  local_a0 = lcTuioBundle::category.name;
                  QMessageLogger::warning((char *)&local_b8,"Invalid sub-message");
                }
              }
              pQVar18 = (QOscBundle *)&local_d8;
              QArrayDataPointer<QVariant>::~QArrayDataPointer
                        ((QArrayDataPointer<QVariant> *)pQVar18);
              piVar5 = (int *)CONCAT44(local_f8._12_4_,local_f8._8_4_);
              if (piVar5 != (int *)0x0) {
                LOCK();
                *piVar5 = *piVar5 + -1;
                UNLOCK();
                if (*piVar5 == 0) {
                  pQVar18 = (QOscBundle *)CONCAT44(local_f8._12_4_,local_f8._8_4_);
                  QArrayData::deallocate((QArrayData *)pQVar18,1,0x10);
                }
              }
              if (bVar7 == false) {
LAB_00105d82:
                if ((QOscBundle *)local_98.d.d != (QOscBundle *)0x0) {
                  LOCK();
                  *(int *)local_98.d.d = *(int *)local_98.d.d + -1;
                  UNLOCK();
                  if (*(int *)local_98.d.d == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
                  }
                }
                if ((QOscBundle *)local_78.d.d != (QOscBundle *)0x0) {
                  LOCK();
                  *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
                  iVar1 = *(int *)local_78.d.d;
                  UNLOCK();
                  QVar3.stream = (Stream *)local_78.d.d;
                  goto joined_r0x00105ce3;
                }
                break;
              }
            }
            if ((QOscBundle *)local_98.d.d != (QOscBundle *)0x0) {
              LOCK();
              *(int *)local_98.d.d = *(int *)local_98.d.d + -1;
              UNLOCK();
              if (*(int *)local_98.d.d == 0) {
                pQVar18 = (QOscBundle *)local_98.d.d;
                QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
              }
            }
            if ((QOscBundle *)local_78.d.d != (QOscBundle *)0x0) {
              LOCK();
              *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
              UNLOCK();
              if (*(int *)local_78.d.d == 0) {
                pQVar18 = (QOscBundle *)local_78.d.d;
                QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
              }
            }
            uVar20 = uVar20 + 4 + uVar19;
            lVar12 = (data->d).size;
          } while (uVar20 < (uint)lVar12);
        }
      }
    }
  }
  if ((QArrayData *)local_58.stream != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58.stream = *(int *)local_58.stream + -1;
    UNLOCK();
    if (*(int *)local_58.stream == 0) {
      QArrayData::deallocate((QArrayData *)local_58.stream,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOscBundle::QOscBundle(const QByteArray &data)
    : m_isValid(false)
    , m_immediate(false)
    , m_timeEpoch(0)
    , m_timePico(0)
{
    // 8  16 24 32 40 48 56 64
    // #  b  u  n  d  l  e  \0
    // 23 62 75 6e 64 6c 65 00 // OSC string bundle identifier
    // 00 00 00 00 00 00 00 01 // osc time-tag, "immediately"
    // 00 00 00 30 // element length
    //      => message or bundle(s), preceded by length each time
    qCDebug(lcTuioBundle) << data.toHex();
    quint32 parsedBytes = 0;

    // "An OSC Bundle consists of the OSC-string "#bundle""
    QByteArray identifier;
    if (!qt_readOscString(data, identifier, parsedBytes) || identifier != "#bundle")
        return;

    // "followed by an OSC Time
    // Tag, followed by zero or more OSC Bundle Elements. The OSC-timetag is a
    // 64-bit fixed point time tag whose semantics are described below."
    if (parsedBytes > (quint32)data.size() || data.size() - parsedBytes < qsizetype(sizeof(quint64)))
        return;

    // "Time tags are represented by a 64 bit fixed point number. The first 32
    // bits specify the number of seconds since midnight on January 1,  1900,
    // and the last 32 bits specify fractional parts of a second to a precision
    // of about 200 picoseconds. This is the representation used by Internet NTP
    // timestamps."
    //
    // (editor's note: one may wonder how a 64bit big-endian number can also be
    // two 32bit numbers, without specifying in which order they occur or
    // anything, and one may indeed continue to wonder.)
    quint32 oscTimeEpoch = qFromBigEndian<quint32>(data.constData() + parsedBytes);
    parsedBytes += sizeof(quint32);
    quint32 oscTimePico = qFromBigEndian<quint32>(data.constData() + parsedBytes);
    parsedBytes += sizeof(quint32);

    bool isImmediate = false;

    if (oscTimeEpoch == 0 && oscTimePico == 1) {
        // "The time tag value consisting of 63 zero bits followed by a
        // one in the least significant bit is a special case meaning
        // "immediately.""
        isImmediate = true;
    }

    while (parsedBytes < (quint32)data.size()) {
        // "An OSC Bundle Element consists of its size and its contents. The size is an
        // int32 representing the number of 8-bit bytes in the contents, and will
        // always be a multiple of 4."
        //
        // in practice, a bundle can contain multiple bundles or messages,
        // though, and each is prefixed by a size.
        if (data.size() - parsedBytes < qsizetype(sizeof(quint32)))
            return;

        quint32 size = qFromBigEndian<quint32>((const uchar*)data.constData() + parsedBytes);
        parsedBytes += sizeof(quint32);

        if (data.size() - parsedBytes < size)
            return;

        if (size == 0) {
            // empty bundle; these are valid, but should they be allowed? the
            // spec is unclear on this...
            qCWarning(lcTuioBundle, "Empty bundle?");
            m_isValid = true;
            m_immediate = isImmediate;
            m_timeEpoch = oscTimeEpoch;
            m_timePico = oscTimePico;
            return;
        }

        // "The contents are either an OSC Message or an OSC Bundle.
        // Note this recursive definition: bundle may contain bundles."
        QByteArray subdata = data.mid(parsedBytes, size);
        parsedBytes += size;

        // "The contents of an OSC packet must be either an OSC Message or an OSC Bundle.
        // The first byte of the packet's contents unambiguously distinguishes between
        // these two alternatives."
        //
        // we're not dealing with a packet here, but the same trick works just
        // the same.
        QByteArray bundleIdentifier = QByteArray("#bundle\0",  8);
        if (subdata.startsWith('/')) {
            // starts with / => address pattern => start of a message
            QOscMessage subMessage(subdata);
            if (subMessage.isValid()) {
                m_isValid = true;
                m_immediate = isImmediate;
                m_timeEpoch = oscTimeEpoch;
                m_timePico = oscTimePico;
                m_messages.append(subMessage);
            } else {
                qCWarning(lcTuioBundle, "Invalid sub-message");
                return;
            }
        } else if (subdata.startsWith(bundleIdentifier)) {
            // bundle identifier start => bundle
            QOscBundle subBundle(subdata);
            if (subBundle.isValid()) {
                m_isValid = true;
                m_immediate = isImmediate;
                m_timeEpoch = oscTimeEpoch;
                m_timePico = oscTimePico;
                m_bundles.append(subBundle);
            }
        } else {
            qCWarning(lcTuioBundle, "Malformed sub-data!");
            return;
        }
    }
}